

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O0

void btSoftBodyHelpers::Draw(btSoftBody *psb,btIDebugDraw *idraw,int drawflags)

{
  Node *pNVar1;
  int iVar2;
  int iVar3;
  Cluster **ppCVar4;
  Node **ppNVar5;
  btVector3 *pbVar6;
  int *piVar7;
  btVector3 *pbVar8;
  btVector3 *pbVar9;
  Joint **ppJVar10;
  btTransform *pbVar11;
  uint in_EDX;
  btConvexHullComputer *in_RSI;
  long in_RDI;
  btScalar bVar12;
  btVector3 bVar13;
  btVector3 a1_1;
  btVector3 a0_1;
  btVector3 o1;
  btVector3 o0;
  btVector3 a1;
  btVector3 a0;
  LJoint *pjl;
  Joint *pj;
  int j_1;
  btVector3 p;
  Note *n_3;
  Node *n_2;
  btVector3 q;
  Anchor *a;
  btVector3 c_2;
  btVector3 x_2 [4];
  Tetra *t;
  int i_2;
  btVector3 col_1;
  btScalar alp_1;
  btScalar scl_2;
  btVector3 c_1;
  btVector3 x_1 [3];
  Face *f;
  btVector3 col;
  btScalar alp;
  btScalar scl_1;
  btVector3 y;
  btVector3 x;
  btVector3 o;
  RContact *c;
  btVector3 d;
  Node *n_1;
  Link *l;
  Node *n;
  int v2;
  int v1;
  int v0;
  Edge *edge;
  Edge *firstEdge;
  int face;
  int i_1;
  btScalar shrinkClamp;
  btScalar shrink;
  int count;
  int stride;
  btConvexHullComputer computer;
  btAlignedObjectArray<btVector3> vertices;
  btVector3 color;
  int nj;
  int j;
  int i;
  btVector3 ccolor;
  btVector3 ncolor;
  btVector3 lcolor;
  btScalar nscl;
  btScalar scl;
  btScalar in_stack_fffffffffffff118;
  btScalar in_stack_fffffffffffff11c;
  btConvexHullComputer *in_stack_fffffffffffff120;
  btVector3 *in_stack_fffffffffffff128;
  btConvexHullComputer *in_stack_fffffffffffff130;
  Body *in_stack_fffffffffffff138;
  btConvexHullComputer *in_stack_fffffffffffff140;
  undefined8 in_stack_fffffffffffff160;
  btIDebugDraw *in_stack_fffffffffffff168;
  undefined8 *puVar14;
  btSoftBody *in_stack_fffffffffffff170;
  btConvexHullComputer *pbVar15;
  btVector3 *in_stack_fffffffffffff288;
  btConvexHullComputer *in_stack_fffffffffffff290;
  undefined4 in_stack_fffffffffffff298;
  int in_stack_fffffffffffff29c;
  btVector3 *in_stack_fffffffffffff2a0;
  btScalar local_b78;
  btScalar local_b74;
  btScalar local_b70;
  btVector3 local_b6c;
  undefined4 local_b5c;
  undefined8 local_b58;
  undefined8 local_b50;
  undefined8 local_b48;
  undefined8 local_b40;
  btScalar local_b38;
  btScalar local_b34;
  btScalar local_b30;
  btVector3 local_b2c;
  undefined4 local_b1c;
  undefined8 local_b18;
  undefined8 local_b10;
  undefined8 local_b08;
  undefined8 local_b00;
  btScalar local_af8;
  btScalar local_af4;
  btScalar local_af0;
  btVector3 local_aec;
  undefined4 local_adc;
  undefined8 local_ad8;
  undefined8 local_ad0;
  undefined8 local_ac8;
  undefined8 local_ac0;
  btScalar local_ab8;
  btScalar local_ab4;
  btScalar local_ab0;
  btVector3 local_aac;
  undefined4 local_a9c;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined8 local_a80;
  undefined8 local_a78;
  undefined8 local_a70;
  undefined8 local_a68;
  undefined8 local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined1 local_a48 [16];
  btScalar local_a38;
  btScalar local_a34;
  btScalar local_a30;
  btVector3 local_a2c;
  btScalar local_a1c;
  btScalar local_a18;
  btScalar local_a14;
  btVector3 local_a10;
  btScalar local_a00;
  btScalar local_9fc;
  btScalar local_9f8;
  btVector3 local_9f4;
  btScalar local_9e4;
  btScalar local_9e0;
  btScalar local_9dc;
  btVector3 local_9d8;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  Joint *local_9a8;
  Joint *local_9a0;
  btVector3 local_994;
  int local_984;
  btVector3 local_980;
  Note *local_970;
  btScalar local_964;
  btScalar local_960;
  btScalar local_95c;
  btVector3 local_958;
  Node *local_948;
  btScalar local_93c;
  btScalar local_938;
  btScalar local_934;
  btVector3 local_930;
  btScalar local_920;
  btScalar local_91c;
  btScalar local_918;
  btVector3 local_914;
  btScalar local_904;
  btScalar local_900;
  btScalar local_8fc;
  btVector3 local_8f8;
  undefined8 local_8e8;
  undefined8 local_8e0;
  Anchor *local_8d8;
  undefined8 local_8cc;
  undefined8 local_8c4;
  undefined8 local_8bc;
  undefined8 local_8b4;
  undefined8 local_8ac;
  undefined8 local_8a4;
  undefined8 local_89c;
  undefined8 local_894;
  undefined8 local_88c;
  undefined8 local_884;
  undefined8 local_87c;
  undefined8 local_874;
  undefined8 local_86c;
  undefined8 local_864;
  undefined8 local_85c;
  undefined8 local_854;
  undefined8 local_84c;
  undefined8 local_844;
  undefined8 local_83c;
  undefined8 local_834;
  undefined8 local_82c;
  undefined8 local_824;
  undefined8 local_81c;
  undefined8 local_814;
  undefined8 local_80c;
  undefined8 local_804;
  undefined8 local_7fc;
  undefined8 local_7f4;
  undefined8 local_7ec;
  undefined8 local_7e4;
  undefined8 local_7dc;
  undefined8 local_7d4;
  undefined8 local_7cc;
  undefined8 local_7c4;
  undefined8 local_7bc;
  undefined8 local_7b4;
  undefined8 local_7ac;
  undefined8 local_7a4;
  undefined8 local_79c;
  undefined8 local_794;
  undefined8 local_78c;
  undefined8 local_784;
  undefined8 local_77c;
  undefined8 local_774;
  undefined8 local_76c;
  undefined8 local_764;
  undefined8 local_75c;
  undefined8 local_754;
  undefined8 local_74c;
  undefined8 local_744;
  undefined8 local_73c;
  undefined8 local_734;
  undefined8 local_72c;
  undefined8 local_724;
  undefined8 local_71c;
  undefined8 local_714;
  undefined8 local_70c;
  undefined8 local_704;
  undefined8 local_6fc;
  undefined8 local_6f4;
  undefined8 local_6ec;
  undefined8 local_6e4;
  undefined8 local_6dc;
  undefined8 local_6d4;
  undefined8 local_6cc;
  undefined8 local_6c4;
  undefined8 local_6bc;
  undefined8 local_6b4;
  undefined8 local_6ac;
  undefined8 local_6a4;
  undefined8 local_69c;
  undefined8 local_694;
  undefined4 local_68c;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  Tetra *local_600;
  int local_5f4;
  btScalar local_5f0;
  btScalar local_5ec;
  btScalar local_5e8;
  btVector3 local_5e4;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined8 local_5cc;
  undefined8 local_5c4;
  undefined8 local_5bc;
  undefined8 local_5b4;
  undefined8 local_5ac;
  undefined8 local_5a4;
  undefined8 local_59c;
  undefined8 local_594;
  undefined8 local_58c;
  undefined8 local_584;
  undefined8 local_57c;
  undefined8 local_574;
  undefined8 local_56c;
  undefined8 local_564;
  undefined8 local_55c;
  undefined8 local_554;
  undefined8 local_54c;
  undefined8 local_544;
  undefined4 local_53c;
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  btVector3 local_518;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  Face *local_4d0;
  btScalar local_4c8;
  btScalar local_4c4;
  btScalar local_4c0;
  btVector3 local_4bc;
  undefined4 local_4ac;
  undefined4 local_4a8;
  btScalar local_4a4;
  btScalar local_4a0;
  btScalar local_49c;
  btVector3 local_498;
  undefined4 local_488;
  undefined8 local_484;
  undefined8 local_47c;
  undefined8 local_474;
  undefined8 local_46c;
  undefined8 local_464;
  undefined8 local_45c;
  undefined8 local_454;
  undefined8 local_44c;
  undefined8 local_444;
  undefined8 local_43c;
  undefined8 local_434;
  undefined8 local_42c;
  undefined8 local_424;
  undefined8 local_41c;
  undefined8 local_414;
  undefined8 local_40c;
  undefined8 local_404;
  undefined8 local_3fc;
  undefined8 local_3f4;
  undefined8 local_3ec;
  undefined8 local_3e4;
  undefined8 local_3dc;
  undefined8 local_3d4;
  undefined8 local_3cc;
  undefined8 local_3c4;
  undefined8 local_3bc;
  undefined8 local_3b4;
  undefined8 local_3ac;
  undefined8 local_3a4;
  undefined8 local_39c;
  float local_394;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  RContact *local_370;
  btScalar local_368;
  btScalar local_364;
  btScalar local_360;
  btScalar local_35c;
  btScalar local_358;
  btScalar local_354;
  btScalar local_350;
  btScalar local_34c;
  btScalar local_348 [2];
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  Node *local_300;
  Link *local_2f8;
  btScalar local_2ec;
  btScalar local_2e8;
  btScalar local_2e4;
  btVector3 local_2e0;
  btScalar local_2d0;
  btScalar local_2cc;
  btVector3 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2b0;
  btScalar local_2a8;
  btScalar local_2a4;
  btVector3 local_2a0;
  undefined8 local_290;
  undefined8 local_288;
  btScalar local_280;
  btScalar local_27c;
  btScalar local_278;
  btVector3 local_274;
  btScalar local_264;
  btScalar local_260;
  btVector3 local_25c;
  undefined8 local_24c;
  undefined8 local_244;
  btScalar local_23c;
  btScalar local_238;
  btVector3 local_234;
  undefined8 local_224;
  undefined8 local_21c;
  btScalar local_214;
  btScalar local_210;
  btScalar local_20c;
  btVector3 local_208;
  btScalar local_1f8;
  btScalar local_1f4;
  btVector3 local_1f0;
  undefined8 local_1e0;
  undefined8 local_1d8;
  btScalar local_1d0;
  btScalar local_1cc;
  btVector3 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1b0;
  Node *local_1a8;
  int local_19c;
  int local_198;
  int local_194;
  Edge *local_190;
  Edge *local_188;
  int local_180;
  int local_17c;
  undefined4 local_178;
  undefined4 local_174;
  int local_170;
  undefined4 local_16c;
  btAlignedObjectArray<btVector3> local_168;
  btAlignedObjectArray<btConvexHullComputer::Edge> local_148;
  btAlignedObjectArray<int> local_128;
  btVector3 local_104;
  btAlignedObjectArray<btVector3> local_e8;
  undefined4 local_c8;
  undefined8 local_c4;
  undefined8 local_bc;
  btScalar local_b4 [2];
  btScalar abStack_ac [2];
  float local_a4;
  float local_a0;
  float local_9c;
  btVector3 local_98;
  int local_7c;
  int local_78;
  int local_74;
  btScalar local_70;
  btScalar local_6c;
  btScalar local_68;
  btVector3 local_64;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btVector3 local_48;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btVector3 local_2c;
  undefined4 local_1c;
  btScalar local_18;
  uint local_14;
  btConvexHullComputer *local_10;
  long local_8;
  
  local_18 = 0.1;
  local_1c = 0x3f000000;
  local_30 = 0.0;
  local_34 = 0.0;
  local_38 = 0.0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  btVector3::btVector3(&local_2c,&local_30,&local_34,&local_38);
  local_4c = 1.0;
  local_50 = 1.0;
  local_54 = 1.0;
  btVector3::btVector3(&local_48,&local_4c,&local_50,&local_54);
  local_68 = 1.0;
  local_6c = 0.0;
  local_70 = 0.0;
  btVector3::btVector3(&local_64,&local_68,&local_6c,&local_70);
  if ((local_14 & 0x100) == 0) {
    if ((local_14 & 1) != 0) {
      for (local_74 = 0; iVar3 = local_74,
          iVar2 = btAlignedObjectArray<btSoftBody::Node>::size
                            ((btAlignedObjectArray<btSoftBody::Node> *)(local_8 + 0x370)),
          iVar3 < iVar2; local_74 = local_74 + 1) {
        local_1a8 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Node> *)(local_8 + 0x370),local_74)
        ;
        pbVar15 = local_10;
        if ((((local_1a8->super_Feature).m_material)->m_flags & 1U) != 0) {
          local_1cc = 0.0;
          local_1d0 = 0.0;
          btVector3::btVector3(&local_1c8,&local_18,&local_1cc,&local_1d0);
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_1b0 = bVar13.m_floats._8_8_;
          local_1b8 = bVar13.m_floats._0_8_;
          local_1f4 = 0.0;
          local_1f8 = 0.0;
          btVector3::btVector3(&local_1f0,&local_18,&local_1f4,&local_1f8);
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_1d8 = bVar13.m_floats._8_8_;
          local_1e0 = bVar13.m_floats._0_8_;
          local_20c = 1.0;
          local_210 = 0.0;
          local_214 = 0.0;
          btVector3::btVector3(&local_208,&local_20c,&local_210,&local_214);
          (**(code **)(*(long *)&pbVar15->vertices + 0x20))
                    (pbVar15,&local_1b8,&local_1e0,&local_208);
          pbVar15 = local_10;
          local_238 = 0.0;
          local_23c = 0.0;
          btVector3::btVector3(&local_234,&local_238,&local_18,&local_23c);
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_21c = bVar13.m_floats._8_8_;
          local_224 = bVar13.m_floats._0_8_;
          local_260 = 0.0;
          local_264 = 0.0;
          btVector3::btVector3(&local_25c,&local_260,&local_18,&local_264);
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_244 = bVar13.m_floats._8_8_;
          local_24c = bVar13.m_floats._0_8_;
          local_278 = 0.0;
          local_27c = 1.0;
          local_280 = 0.0;
          btVector3::btVector3(&local_274,&local_278,&local_27c,&local_280);
          (**(code **)(*(long *)&pbVar15->vertices + 0x20))
                    (pbVar15,&local_224,&local_24c,&local_274);
          pbVar15 = local_10;
          local_2a4 = 0.0;
          local_2a8 = 0.0;
          btVector3::btVector3(&local_2a0,&local_2a4,&local_2a8,&local_18);
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_288 = bVar13.m_floats._8_8_;
          local_290 = bVar13.m_floats._0_8_;
          local_2cc = 0.0;
          local_2d0 = 0.0;
          btVector3::btVector3(&local_2c8,&local_2cc,&local_2d0,&local_18);
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_2b0 = bVar13.m_floats._8_8_;
          local_2b8 = bVar13.m_floats._0_8_;
          local_2e4 = 0.0;
          local_2e8 = 0.0;
          local_2ec = 1.0;
          btVector3::btVector3(&local_2e0,&local_2e4,&local_2e8,&local_2ec);
          (**(code **)(*(long *)&pbVar15->vertices + 0x20))
                    (pbVar15,&local_290,&local_2b8,&local_2e0);
        }
      }
    }
    if ((local_14 & 2) != 0) {
      for (local_74 = 0; iVar3 = local_74,
          iVar2 = btAlignedObjectArray<btSoftBody::Link>::size
                            ((btAlignedObjectArray<btSoftBody::Link> *)(local_8 + 0x390)),
          iVar3 < iVar2; local_74 = local_74 + 1) {
        local_2f8 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Link> *)(local_8 + 0x390),local_74)
        ;
        if ((((local_2f8->super_Feature).m_material)->m_flags & 1U) != 0) {
          (**(code **)(*(long *)&local_10->vertices + 0x20))
                    (local_10,&local_2f8->m_n[0]->m_x,&local_2f8->m_n[1]->m_x,&local_2c);
        }
      }
    }
    if ((local_14 & 0x10) != 0) {
      for (local_74 = 0; iVar3 = local_74,
          iVar2 = btAlignedObjectArray<btSoftBody::Node>::size
                            ((btAlignedObjectArray<btSoftBody::Node> *)(local_8 + 0x370)),
          iVar3 < iVar2; local_74 = local_74 + 1) {
        local_300 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Node> *)(local_8 + 0x370),local_74)
        ;
        if ((((local_300->super_Feature).m_material)->m_flags & 1U) != 0) {
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          pbVar15 = local_10;
          local_308 = bVar13.m_floats._8_8_;
          local_310 = bVar13.m_floats._0_8_;
          pbVar6 = &local_300->m_x;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_318 = bVar13.m_floats._8_8_;
          local_320 = bVar13.m_floats._0_8_;
          (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,pbVar6,&local_320);
          pbVar15 = local_10;
          pbVar6 = &local_300->m_x;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_328 = bVar13.m_floats._8_8_;
          local_330 = bVar13.m_floats._0_8_;
          local_348[1] = 0.5;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_338 = bVar13.m_floats._8_8_;
          local_340 = bVar13.m_floats._0_8_;
          (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,pbVar6,&local_330,&local_340);
        }
      }
    }
    if ((local_14 & 0x20) != 0) {
      if ((Draw(btSoftBody*,btIDebugDraw*,int)::axis == '\0') &&
         (iVar3 = __cxa_guard_acquire(&Draw(btSoftBody*,btIDebugDraw*,int)::axis), iVar3 != 0)) {
        local_348[0] = 1.0;
        local_34c = 0.0;
        local_350 = 0.0;
        btVector3::btVector3(Draw::axis,local_348,&local_34c,&local_350);
        local_354 = 0.0;
        local_358 = 1.0;
        local_35c = 0.0;
        btVector3::btVector3(Draw::axis + 1,&local_354,&local_358,&local_35c);
        local_360 = 0.0;
        local_364 = 0.0;
        local_368 = 1.0;
        btVector3::btVector3(Draw::axis + 2,&local_360,&local_364,&local_368);
        __cxa_guard_release(&Draw(btSoftBody*,btIDebugDraw*,int)::axis);
      }
      for (local_74 = 0; iVar3 = local_74,
          iVar2 = btAlignedObjectArray<btSoftBody::RContact>::size
                            ((btAlignedObjectArray<btSoftBody::RContact> *)(local_8 + 0x410)),
          iVar3 < iVar2; local_74 = local_74 + 1) {
        local_370 = btAlignedObjectArray<btSoftBody::RContact>::operator[]
                              ((btAlignedObjectArray<btSoftBody::RContact> *)(local_8 + 0x410),
                               local_74);
        in_stack_fffffffffffff2a0 = &(local_370->m_cti).m_normal;
        bVar12 = btDot((btVector3 *)in_stack_fffffffffffff120,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
        local_394 = bVar12 + (local_370->m_cti).m_offset;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_388 = bVar13.m_floats._8_8_;
        local_390 = bVar13.m_floats._0_8_;
        bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_378 = bVar13.m_floats._8_8_;
        local_380 = bVar13.m_floats._0_8_;
        btVector3::minAxis(&(local_370->m_cti).m_normal);
        bVar13 = btCross((btVector3 *)in_stack_fffffffffffff120,
                         (btVector3 *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118))
        ;
        local_3ac = bVar13.m_floats._8_8_;
        local_3b4 = bVar13.m_floats._0_8_;
        bVar13 = btVector3::normalized(in_stack_fffffffffffff128);
        local_39c = bVar13.m_floats._8_8_;
        local_3a4 = bVar13.m_floats._0_8_;
        bVar13 = btCross((btVector3 *)in_stack_fffffffffffff120,
                         (btVector3 *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118))
        ;
        local_3cc = bVar13.m_floats._8_8_;
        local_3d4 = bVar13.m_floats._0_8_;
        bVar13 = btVector3::normalized(in_stack_fffffffffffff128);
        pbVar15 = local_10;
        local_3bc = bVar13.m_floats._8_8_;
        local_3c4 = bVar13.m_floats._0_8_;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_3ec = bVar13.m_floats._8_8_;
        local_3f4 = bVar13.m_floats._0_8_;
        bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_3dc = bVar13.m_floats._8_8_;
        local_3e4 = bVar13.m_floats._0_8_;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_40c = bVar13.m_floats._8_8_;
        local_414 = bVar13.m_floats._0_8_;
        bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_3fc = bVar13.m_floats._8_8_;
        local_404 = bVar13.m_floats._0_8_;
        (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,&local_3e4,&local_404);
        pbVar15 = local_10;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_42c = bVar13.m_floats._8_8_;
        local_434 = bVar13.m_floats._0_8_;
        bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_41c = bVar13.m_floats._8_8_;
        local_424 = bVar13.m_floats._0_8_;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_44c = bVar13.m_floats._8_8_;
        local_454 = bVar13.m_floats._0_8_;
        bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_43c = bVar13.m_floats._8_8_;
        local_444 = bVar13.m_floats._0_8_;
        (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,&local_424,&local_444,&local_64);
        pbVar15 = local_10;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_47c = bVar13.m_floats._8_8_;
        local_484 = bVar13.m_floats._0_8_;
        local_488 = 0x40400000;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_46c = bVar13.m_floats._8_8_;
        local_474 = bVar13.m_floats._0_8_;
        bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_45c = bVar13.m_floats._8_8_;
        local_464 = bVar13.m_floats._0_8_;
        local_49c = 1.0;
        local_4a0 = 1.0;
        local_4a4 = 0.0;
        btVector3::btVector3(&local_498,&local_49c,&local_4a0,&local_4a4);
        (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,&local_380,&local_464,&local_498);
      }
    }
    if ((local_14 & 4) != 0) {
      local_4a8 = 0x3f4ccccd;
      local_4ac = 0x3f800000;
      local_4c0 = 0.0;
      local_4c4 = 0.7;
      local_4c8 = 0.0;
      btVector3::btVector3(&local_4bc,&local_4c0,&local_4c4,&local_4c8);
      local_74 = 0;
      while (in_stack_fffffffffffff29c = local_74,
            iVar3 = btAlignedObjectArray<btSoftBody::Face>::size
                              ((btAlignedObjectArray<btSoftBody::Face> *)(local_8 + 0x3b0)),
            in_stack_fffffffffffff29c < iVar3) {
        local_4d0 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Face> *)(local_8 + 0x3b0),local_74)
        ;
        if ((((local_4d0->super_Feature).m_material)->m_flags & 1U) != 0) {
          local_508 = *(undefined8 *)(local_4d0->m_n[0]->m_x).m_floats;
          uStack_500 = *(undefined8 *)((local_4d0->m_n[0]->m_x).m_floats + 2);
          local_4f8 = *(undefined8 *)(local_4d0->m_n[1]->m_x).m_floats;
          uStack_4f0 = *(undefined8 *)((local_4d0->m_n[1]->m_x).m_floats + 2);
          local_4e8 = *(undefined8 *)(local_4d0->m_n[2]->m_x).m_floats;
          uStack_4e0 = *(undefined8 *)((local_4d0->m_n[2]->m_x).m_floats + 2);
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_530 = bVar13.m_floats._8_8_;
          local_538 = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_520 = bVar13.m_floats._8_8_;
          local_528 = bVar13.m_floats._0_8_;
          local_53c = 0x40400000;
          bVar13 = operator/((btVector3 *)in_stack_fffffffffffff120,
                             (btScalar *)
                             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
          local_518.m_floats._8_8_ = bVar13.m_floats._8_8_;
          local_518.m_floats._0_8_ = bVar13.m_floats._0_8_;
          in_stack_fffffffffffff288 = &local_518;
          in_stack_fffffffffffff290 = local_10;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_564 = bVar13.m_floats._8_8_;
          local_56c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_554 = bVar13.m_floats._8_8_;
          local_55c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_544 = bVar13.m_floats._8_8_;
          local_54c = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_594 = bVar13.m_floats._8_8_;
          local_59c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_584 = bVar13.m_floats._8_8_;
          local_58c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_574 = bVar13.m_floats._8_8_;
          local_57c = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_5c4 = bVar13.m_floats._8_8_;
          local_5cc = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_5b4 = bVar13.m_floats._8_8_;
          local_5bc = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_5a4 = bVar13.m_floats._8_8_;
          local_5ac = bVar13.m_floats._0_8_;
          (**(code **)(*(long *)&in_stack_fffffffffffff290->vertices + 0x48))
                    (0x3f800000,in_stack_fffffffffffff290,&local_54c,&local_57c,&local_5ac,
                     &local_4bc);
        }
        local_74 = local_74 + 1;
      }
    }
    if ((local_14 & 8) != 0) {
      local_5d0 = 0x3f4ccccd;
      local_5d4 = 0x3f800000;
      local_5e8 = 0.3;
      local_5ec = 0.3;
      local_5f0 = 0.7;
      btVector3::btVector3(&local_5e4,&local_5e8,&local_5ec,&local_5f0);
      for (local_5f4 = 0; iVar3 = local_5f4,
          iVar2 = btAlignedObjectArray<btSoftBody::Tetra>::size
                            ((btAlignedObjectArray<btSoftBody::Tetra> *)(local_8 + 0x3d0)),
          iVar3 < iVar2; local_5f4 = local_5f4 + 1) {
        local_600 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Tetra> *)(local_8 + 0x3d0),
                               local_5f4);
        if ((((local_600->super_Feature).m_material)->m_flags & 1U) != 0) {
          local_648 = *(undefined8 *)(local_600->m_n[0]->m_x).m_floats;
          uStack_640 = *(undefined8 *)((local_600->m_n[0]->m_x).m_floats + 2);
          local_638 = *(undefined8 *)(local_600->m_n[1]->m_x).m_floats;
          uStack_630 = *(undefined8 *)((local_600->m_n[1]->m_x).m_floats + 2);
          local_628 = *(undefined8 *)(local_600->m_n[2]->m_x).m_floats;
          uStack_620 = *(undefined8 *)((local_600->m_n[2]->m_x).m_floats + 2);
          local_618 = *(undefined8 *)(local_600->m_n[3]->m_x).m_floats;
          uStack_610 = *(undefined8 *)((local_600->m_n[3]->m_x).m_floats + 2);
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_680 = bVar13.m_floats._8_8_;
          local_688 = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_670 = bVar13.m_floats._8_8_;
          local_678 = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_660 = bVar13.m_floats._8_8_;
          local_668 = bVar13.m_floats._0_8_;
          local_68c = 0x40800000;
          bVar13 = operator/((btVector3 *)in_stack_fffffffffffff120,
                             (btScalar *)
                             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
          pbVar15 = local_10;
          local_650 = bVar13.m_floats._8_8_;
          local_658 = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_6b4 = bVar13.m_floats._8_8_;
          local_6bc = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_6a4 = bVar13.m_floats._8_8_;
          local_6ac = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_694 = bVar13.m_floats._8_8_;
          local_69c = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_6e4 = bVar13.m_floats._8_8_;
          local_6ec = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_6d4 = bVar13.m_floats._8_8_;
          local_6dc = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_6c4 = bVar13.m_floats._8_8_;
          local_6cc = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_714 = bVar13.m_floats._8_8_;
          local_71c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_704 = bVar13.m_floats._8_8_;
          local_70c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_6f4 = bVar13.m_floats._8_8_;
          local_6fc = bVar13.m_floats._0_8_;
          (**(code **)(*(long *)&pbVar15->vertices + 0x48))
                    (pbVar15,&local_69c,&local_6cc,&local_6fc);
          pbVar15 = local_10;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_744 = bVar13.m_floats._8_8_;
          local_74c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_734 = bVar13.m_floats._8_8_;
          local_73c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_724 = bVar13.m_floats._8_8_;
          local_72c = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_774 = bVar13.m_floats._8_8_;
          local_77c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_764 = bVar13.m_floats._8_8_;
          local_76c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_754 = bVar13.m_floats._8_8_;
          local_75c = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_7a4 = bVar13.m_floats._8_8_;
          local_7ac = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_794 = bVar13.m_floats._8_8_;
          local_79c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_784 = bVar13.m_floats._8_8_;
          local_78c = bVar13.m_floats._0_8_;
          (**(code **)(*(long *)&pbVar15->vertices + 0x48))
                    (0x3f800000,pbVar15,&local_72c,&local_75c,&local_78c,&local_5e4);
          pbVar15 = local_10;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_7d4 = bVar13.m_floats._8_8_;
          local_7dc = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_7c4 = bVar13.m_floats._8_8_;
          local_7cc = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_7b4 = bVar13.m_floats._8_8_;
          local_7bc = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_804 = bVar13.m_floats._8_8_;
          local_80c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_7f4 = bVar13.m_floats._8_8_;
          local_7fc = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_7e4 = bVar13.m_floats._8_8_;
          local_7ec = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_834 = bVar13.m_floats._8_8_;
          local_83c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_824 = bVar13.m_floats._8_8_;
          local_82c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_814 = bVar13.m_floats._8_8_;
          local_81c = bVar13.m_floats._0_8_;
          (**(code **)(*(long *)&pbVar15->vertices + 0x48))
                    (0x3f800000,pbVar15,&local_7bc,&local_7ec,&local_81c,&local_5e4);
          pbVar15 = local_10;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_864 = bVar13.m_floats._8_8_;
          local_86c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_854 = bVar13.m_floats._8_8_;
          local_85c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_844 = bVar13.m_floats._8_8_;
          local_84c = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_894 = bVar13.m_floats._8_8_;
          local_89c = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_884 = bVar13.m_floats._8_8_;
          local_88c = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_874 = bVar13.m_floats._8_8_;
          local_87c = bVar13.m_floats._0_8_;
          bVar13 = operator-((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_8c4 = bVar13.m_floats._8_8_;
          local_8cc = bVar13.m_floats._0_8_;
          bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                               in_stack_fffffffffffff128->m_floats);
          local_8b4 = bVar13.m_floats._8_8_;
          local_8bc = bVar13.m_floats._0_8_;
          bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
          local_8a4 = bVar13.m_floats._8_8_;
          local_8ac = bVar13.m_floats._0_8_;
          (**(code **)(*(long *)&pbVar15->vertices + 0x48))
                    (0x3f800000,pbVar15,&local_84c,&local_87c,&local_8ac,&local_5e4);
        }
      }
    }
  }
  else {
    srand(0x70e);
    for (local_74 = 0; iVar3 = local_74,
        iVar2 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(local_8 + 0x5d8)),
        iVar3 < iVar2; local_74 = local_74 + 1) {
      ppCVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(local_8 + 0x5d8),local_74
                          );
      if (((*ppCVar4)->m_collide & 1U) != 0) {
        iVar3 = rand();
        local_9c = (float)iVar3 * 4.656613e-10;
        iVar3 = rand();
        local_a0 = (float)iVar3 * 4.656613e-10;
        iVar3 = rand();
        local_a4 = (float)iVar3 * 4.656613e-10;
        btVector3::btVector3(&local_98,&local_9c,&local_a0,&local_a4);
        bVar13 = btVector3::normalized(in_stack_fffffffffffff128);
        local_bc = bVar13.m_floats._8_8_;
        local_c4 = bVar13.m_floats._0_8_;
        local_c8 = 0x3f400000;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        abStack_ac = bVar13.m_floats._8_8_;
        local_b4 = bVar13.m_floats._0_8_;
        local_98.m_floats._0_8_ = local_b4;
        local_98.m_floats._8_8_ = abStack_ac;
        btAlignedObjectArray<btVector3>::btAlignedObjectArray(&in_stack_fffffffffffff120->vertices);
        ppCVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(local_8 + 0x5d8),
                             local_74);
        btAlignedObjectArray<btSoftBody::Node_*>::size(&(*ppCVar4)->m_nodes);
        btVector3::btVector3(&local_104);
        btAlignedObjectArray<btVector3>::resize
                  (&in_stack_fffffffffffff140->vertices,
                   (int)((ulong)in_stack_fffffffffffff138 >> 0x20),
                   (btVector3 *)in_stack_fffffffffffff130);
        local_78 = 0;
        local_7c = btAlignedObjectArray<btVector3>::size(&local_e8);
        for (; local_78 < local_7c; local_78 = local_78 + 1) {
          ppCVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(local_8 + 0x5d8),
                               local_74);
          ppNVar5 = btAlignedObjectArray<btSoftBody::Node_*>::operator[]
                              (&(*ppCVar4)->m_nodes,local_78);
          pNVar1 = *ppNVar5;
          pbVar6 = btAlignedObjectArray<btVector3>::operator[](&local_e8,local_78);
          *(undefined8 *)pbVar6->m_floats = *(undefined8 *)(pNVar1->m_x).m_floats;
          *(undefined8 *)(pbVar6->m_floats + 2) = *(undefined8 *)((pNVar1->m_x).m_floats + 2);
        }
        btConvexHullComputer::btConvexHullComputer(in_stack_fffffffffffff140);
        local_16c = 0x10;
        local_170 = btAlignedObjectArray<btVector3>::size(&local_e8);
        local_174 = 0;
        local_178 = 0;
        pbVar6 = btAlignedObjectArray<btVector3>::operator[](&local_e8,0);
        btVector3::getX(pbVar6);
        btConvexHullComputer::compute
                  (in_stack_fffffffffffff130,in_stack_fffffffffffff128->m_floats,
                   (int)((ulong)in_stack_fffffffffffff120 >> 0x20),(int)in_stack_fffffffffffff120,
                   in_stack_fffffffffffff11c,in_stack_fffffffffffff118);
        for (local_17c = 0; iVar3 = local_17c, iVar2 = btAlignedObjectArray<int>::size(&local_128),
            iVar3 < iVar2; local_17c = local_17c + 1) {
          piVar7 = btAlignedObjectArray<int>::operator[](&local_128,local_17c);
          local_180 = *piVar7;
          local_188 = btAlignedObjectArray<btConvexHullComputer::Edge>::operator[]
                                (&local_148,local_180);
          local_190 = btConvexHullComputer::Edge::getNextEdgeOfFace((Edge *)0x28ef71);
          local_194 = btConvexHullComputer::Edge::getSourceVertex(local_188);
          local_198 = btConvexHullComputer::Edge::getTargetVertex(local_188);
          while (local_190 != local_188) {
            local_19c = btConvexHullComputer::Edge::getTargetVertex(local_190);
            pbVar15 = local_10;
            pbVar6 = btAlignedObjectArray<btVector3>::operator[](&local_168,local_194);
            pbVar8 = btAlignedObjectArray<btVector3>::operator[](&local_168,local_198);
            pbVar9 = btAlignedObjectArray<btVector3>::operator[](&local_168,local_19c);
            (**(code **)(*(long *)&pbVar15->vertices + 0x48))
                      (0x3f800000,pbVar15,pbVar6,pbVar8,pbVar9,&local_98);
            local_190 = btConvexHullComputer::Edge::getNextEdgeOfFace((Edge *)0x28f0bf);
            local_194 = local_198;
            local_198 = local_19c;
          }
        }
        btConvexHullComputer::~btConvexHullComputer(in_stack_fffffffffffff120);
        btAlignedObjectArray<btVector3>::~btAlignedObjectArray
                  ((btAlignedObjectArray<btVector3> *)0x28f14f);
      }
    }
  }
  if ((local_14 & 0x40) != 0) {
    for (local_74 = 0; iVar3 = local_74,
        iVar2 = btAlignedObjectArray<btSoftBody::Anchor>::size
                          ((btAlignedObjectArray<btSoftBody::Anchor> *)(local_8 + 0x3f0)),
        iVar3 < iVar2; local_74 = local_74 + 1) {
      local_8d8 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Anchor> *)(local_8 + 0x3f0),local_74)
      ;
      btCollisionObject::getWorldTransform(&local_8d8->m_body->super_btCollisionObject);
      bVar13 = btTransform::operator*
                         ((btTransform *)in_stack_fffffffffffff120,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118)
                         );
      local_8e0 = bVar13.m_floats._8_8_;
      local_8e8 = bVar13.m_floats._0_8_;
      local_8fc = 1.0;
      local_900 = 0.0;
      local_904 = 0.0;
      btVector3::btVector3(&local_8f8,&local_8fc,&local_900,&local_904);
      drawVertex((btIDebugDraw *)in_stack_fffffffffffff2a0,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                 (btScalar)((ulong)in_stack_fffffffffffff290 >> 0x20),in_stack_fffffffffffff288);
      local_918 = 0.0;
      local_91c = 1.0;
      local_920 = 0.0;
      btVector3::btVector3(&local_914,&local_918,&local_91c,&local_920);
      drawVertex((btIDebugDraw *)in_stack_fffffffffffff2a0,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                 (btScalar)((ulong)in_stack_fffffffffffff290 >> 0x20),in_stack_fffffffffffff288);
      pbVar15 = local_10;
      pNVar1 = local_8d8->m_node;
      local_934 = 1.0;
      local_938 = 1.0;
      local_93c = 1.0;
      btVector3::btVector3(&local_930,&local_934,&local_938,&local_93c);
      (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,&pNVar1->m_x,&local_8e8,&local_930);
    }
    for (local_74 = 0; iVar3 = local_74,
        iVar2 = btAlignedObjectArray<btSoftBody::Node>::size
                          ((btAlignedObjectArray<btSoftBody::Node> *)(local_8 + 0x370)),
        iVar3 < iVar2; local_74 = local_74 + 1) {
      local_948 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Node> *)(local_8 + 0x370),local_74);
      if (((((local_948->super_Feature).m_material)->m_flags & 1U) != 0) && (local_948->m_im <= 0.0)
         ) {
        local_95c = 1.0;
        local_960 = 0.0;
        local_964 = 0.0;
        btVector3::btVector3(&local_958,&local_95c,&local_960,&local_964);
        drawVertex((btIDebugDraw *)in_stack_fffffffffffff2a0,
                   (btVector3 *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                   (btScalar)((ulong)in_stack_fffffffffffff290 >> 0x20),in_stack_fffffffffffff288);
      }
    }
  }
  if ((local_14 & 0x80) != 0) {
    for (local_74 = 0; iVar3 = local_74,
        iVar2 = btAlignedObjectArray<btSoftBody::Note>::size
                          ((btAlignedObjectArray<btSoftBody::Note> *)(local_8 + 0x350)),
        iVar3 < iVar2; local_74 = local_74 + 1) {
      local_970 = btAlignedObjectArray<btSoftBody::Note>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Note> *)(local_8 + 0x350),local_74);
      local_980.m_floats._0_8_ = *(undefined8 *)(local_970->m_offset).m_floats;
      local_980.m_floats._8_8_ = *(undefined8 *)((local_970->m_offset).m_floats + 2);
      for (local_984 = 0; local_984 < local_970->m_rank; local_984 = local_984 + 1) {
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_994.m_floats._8_8_ = bVar13.m_floats._8_8_;
        local_994.m_floats._0_8_ = bVar13.m_floats._0_8_;
        btVector3::operator+=(&local_980,&local_994);
      }
      (**(code **)(*(long *)&local_10->vertices + 0x60))(local_10,&local_980,local_970->m_text);
    }
  }
  if ((local_14 & 0x200) != 0) {
    DrawNodeTree(in_stack_fffffffffffff170,in_stack_fffffffffffff168,
                 (int)((ulong)in_stack_fffffffffffff160 >> 0x20),(int)in_stack_fffffffffffff160);
  }
  if ((local_14 & 0x400) != 0) {
    DrawFaceTree(in_stack_fffffffffffff170,in_stack_fffffffffffff168,
                 (int)((ulong)in_stack_fffffffffffff160 >> 0x20),(int)in_stack_fffffffffffff160);
  }
  if ((local_14 & 0x800) != 0) {
    DrawClusterTree(in_stack_fffffffffffff170,in_stack_fffffffffffff168,
                    (int)((ulong)in_stack_fffffffffffff160 >> 0x20),(int)in_stack_fffffffffffff160);
  }
  if ((local_14 & 0x1000) != 0) {
    for (local_74 = 0; iVar3 = local_74,
        iVar2 = btAlignedObjectArray<btSoftBody::Joint_*>::size
                          ((btAlignedObjectArray<btSoftBody::Joint_*> *)(local_8 + 0x450)),
        iVar3 < iVar2; local_74 = local_74 + 1) {
      ppJVar10 = btAlignedObjectArray<btSoftBody::Joint_*>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Joint_*> *)(local_8 + 0x450),local_74)
      ;
      local_9a0 = *ppJVar10;
      iVar3 = (*local_9a0->_vptr_Joint[5])();
      if (iVar3 == 0) {
        local_9a8 = local_9a0;
        btSoftBody::Body::xform(in_stack_fffffffffffff138);
        bVar13 = btTransform::operator*
                           ((btTransform *)in_stack_fffffffffffff120,
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
        local_9b0 = bVar13.m_floats._8_8_;
        local_9b8 = bVar13.m_floats._0_8_;
        btSoftBody::Body::xform(in_stack_fffffffffffff138);
        bVar13 = btTransform::operator*
                           ((btTransform *)in_stack_fffffffffffff120,
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
        pbVar15 = local_10;
        local_9c0 = bVar13.m_floats._8_8_;
        local_9c8 = bVar13.m_floats._0_8_;
        pbVar11 = btSoftBody::Body::xform(in_stack_fffffffffffff138);
        pbVar6 = btTransform::getOrigin(pbVar11);
        local_9dc = 1.0;
        local_9e0 = 1.0;
        local_9e4 = 0.0;
        btVector3::btVector3(&local_9d8,&local_9dc,&local_9e0,&local_9e4);
        (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,pbVar6,&local_9b8,&local_9d8);
        pbVar15 = local_10;
        pbVar11 = btSoftBody::Body::xform(in_stack_fffffffffffff138);
        pbVar6 = btTransform::getOrigin(pbVar11);
        local_9f8 = 0.0;
        local_9fc = 1.0;
        local_a00 = 1.0;
        btVector3::btVector3(&local_9f4,&local_9f8,&local_9fc,&local_a00);
        (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,pbVar6,&local_9c8,&local_9f4);
        local_a14 = 1.0;
        local_a18 = 1.0;
        local_a1c = 0.0;
        btVector3::btVector3(&local_a10,&local_a14,&local_a18,&local_a1c);
        drawVertex((btIDebugDraw *)in_stack_fffffffffffff2a0,
                   (btVector3 *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                   (btScalar)((ulong)in_stack_fffffffffffff290 >> 0x20),in_stack_fffffffffffff288);
        local_a30 = 0.0;
        local_a34 = 1.0;
        local_a38 = 1.0;
        btVector3::btVector3(&local_a2c,&local_a30,&local_a34,&local_a38);
        drawVertex((btIDebugDraw *)in_stack_fffffffffffff2a0,
                   (btVector3 *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                   (btScalar)((ulong)in_stack_fffffffffffff290 >> 0x20),in_stack_fffffffffffff288);
      }
      else if (iVar3 == 1) {
        pbVar11 = btSoftBody::Body::xform(in_stack_fffffffffffff138);
        pbVar6 = btTransform::getOrigin(pbVar11);
        local_a48._0_8_ = *(undefined8 *)pbVar6->m_floats;
        local_a48._8_8_ = *(undefined8 *)(pbVar6->m_floats + 2);
        pbVar11 = btSoftBody::Body::xform(in_stack_fffffffffffff138);
        pbVar6 = btTransform::getOrigin(pbVar11);
        local_a58 = *(undefined8 *)pbVar6->m_floats;
        uStack_a50 = *(undefined8 *)(pbVar6->m_floats + 2);
        pbVar11 = btSoftBody::Body::xform(in_stack_fffffffffffff138);
        btTransform::getBasis(pbVar11);
        bVar13 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_a60 = bVar13.m_floats._8_8_;
        local_a68 = bVar13.m_floats._0_8_;
        pbVar11 = btSoftBody::Body::xform(in_stack_fffffffffffff138);
        btTransform::getBasis(pbVar11);
        bVar13 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_a70 = bVar13.m_floats._8_8_;
        local_a78 = bVar13.m_floats._0_8_;
        local_a9c = 0x41200000;
        in_stack_fffffffffffff120 = local_10;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_a90 = bVar13.m_floats._8_8_;
        local_a98 = bVar13.m_floats._0_8_;
        in_stack_fffffffffffff138 = (Body *)local_a48;
        bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_a80 = bVar13.m_floats._8_8_;
        local_a88 = bVar13.m_floats._0_8_;
        local_ab0 = 1.0;
        local_ab4 = 1.0;
        local_ab8 = 0.0;
        in_stack_fffffffffffff128 = &local_aac;
        btVector3::btVector3(in_stack_fffffffffffff128,&local_ab0,&local_ab4,&local_ab8);
        (**(code **)(*(long *)&in_stack_fffffffffffff120->vertices + 0x20))
                  (in_stack_fffffffffffff120,in_stack_fffffffffffff138,&local_a88,
                   in_stack_fffffffffffff128);
        local_adc = 0x41200000;
        in_stack_fffffffffffff130 = local_10;
        bVar13 = ::operator*((btVector3 *)local_10,in_stack_fffffffffffff128->m_floats);
        local_ad0 = bVar13.m_floats._8_8_;
        local_ad8 = bVar13.m_floats._0_8_;
        bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_ac0 = bVar13.m_floats._8_8_;
        local_ac8 = bVar13.m_floats._0_8_;
        local_af0 = 1.0;
        local_af4 = 1.0;
        local_af8 = 0.0;
        pbVar6 = &local_aec;
        btVector3::btVector3(pbVar6,&local_af0,&local_af4,&local_af8);
        (**(code **)(*(long *)&in_stack_fffffffffffff130->vertices + 0x20))
                  (in_stack_fffffffffffff130,in_stack_fffffffffffff138,&local_ac8,pbVar6);
        pbVar15 = local_10;
        local_b1c = 0x41200000;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_b10 = bVar13.m_floats._8_8_;
        local_b18 = bVar13.m_floats._0_8_;
        puVar14 = &local_a58;
        bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_b00 = bVar13.m_floats._8_8_;
        local_b08 = bVar13.m_floats._0_8_;
        local_b30 = 0.0;
        local_b34 = 1.0;
        local_b38 = 1.0;
        btVector3::btVector3(&local_b2c,&local_b30,&local_b34,&local_b38);
        (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,puVar14,&local_b08,&local_b2c);
        local_b5c = 0x41200000;
        pbVar15 = local_10;
        bVar13 = ::operator*((btVector3 *)in_stack_fffffffffffff130,
                             in_stack_fffffffffffff128->m_floats);
        local_b50 = bVar13.m_floats._8_8_;
        local_b58 = bVar13.m_floats._0_8_;
        bVar13 = operator+((btVector3 *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_b40 = bVar13.m_floats._8_8_;
        local_b48 = bVar13.m_floats._0_8_;
        local_b70 = 0.0;
        local_b74 = 1.0;
        local_b78 = 1.0;
        btVector3::btVector3(&local_b6c,&local_b70,&local_b74,&local_b78);
        (**(code **)(*(long *)&pbVar15->vertices + 0x20))(pbVar15,&local_a58,&local_b48,&local_b6c);
      }
    }
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::Draw(	btSoftBody* psb,
										btIDebugDraw* idraw,
										int drawflags)
{
	const btScalar		scl=(btScalar)0.1;
	const btScalar		nscl=scl*5;
	const btVector3		lcolor=btVector3(0,0,0);
	const btVector3		ncolor=btVector3(1,1,1);
	const btVector3		ccolor=btVector3(1,0,0);
	int i,j,nj;

		/* Clusters	*/ 
	if(0!=(drawflags&fDrawFlags::Clusters))
	{
		srand(1806);
		for(i=0;i<psb->m_clusters.size();++i)
		{
			if(psb->m_clusters[i]->m_collide)
			{
				btVector3						color(	rand()/(btScalar)RAND_MAX,
					rand()/(btScalar)RAND_MAX,
					rand()/(btScalar)RAND_MAX);
				color=color.normalized()*0.75;
				btAlignedObjectArray<btVector3>	vertices;
				vertices.resize(psb->m_clusters[i]->m_nodes.size());
				for(j=0,nj=vertices.size();j<nj;++j)
				{				
					vertices[j]=psb->m_clusters[i]->m_nodes[j]->m_x;
				}
#define USE_NEW_CONVEX_HULL_COMPUTER
#ifdef USE_NEW_CONVEX_HULL_COMPUTER
				btConvexHullComputer	computer;
				int stride = sizeof(btVector3);
				int count = vertices.size();
				btScalar shrink=0.f;
				btScalar shrinkClamp=0.f;
				computer.compute(&vertices[0].getX(),stride,count,shrink,shrinkClamp);
				for (int i=0;i<computer.faces.size();i++)
				{

					int face = computer.faces[i];
					//printf("face=%d\n",face);
					const btConvexHullComputer::Edge*  firstEdge = &computer.edges[face];
					const btConvexHullComputer::Edge*  edge = firstEdge->getNextEdgeOfFace();

					int v0 = firstEdge->getSourceVertex();
					int v1 = firstEdge->getTargetVertex();
					while (edge!=firstEdge)
					{
						int v2 = edge->getTargetVertex();
						idraw->drawTriangle(computer.vertices[v0],computer.vertices[v1],computer.vertices[v2],color,1);
						edge = edge->getNextEdgeOfFace();
						v0=v1;
						v1=v2;
					};
				}
#else

				HullDesc		hdsc(QF_TRIANGLES,vertices.size(),&vertices[0]);
				HullResult		hres;
				HullLibrary		hlib;
				hdsc.mMaxVertices=vertices.size();
				hlib.CreateConvexHull(hdsc,hres);
				const btVector3	center=average(hres.m_OutputVertices);
				add(hres.m_OutputVertices,-center);
				mul(hres.m_OutputVertices,(btScalar)1);
				add(hres.m_OutputVertices,center);
				for(j=0;j<(int)hres.mNumFaces;++j)
				{
					const int idx[]={hres.m_Indices[j*3+0],hres.m_Indices[j*3+1],hres.m_Indices[j*3+2]};
					idraw->drawTriangle(hres.m_OutputVertices[idx[0]],
						hres.m_OutputVertices[idx[1]],
						hres.m_OutputVertices[idx[2]],
						color,1);
				}
				hlib.ReleaseResult(hres);
#endif

			}
			/* Velocities	*/ 
#if 0
			for(int j=0;j<psb->m_clusters[i].m_nodes.size();++j)
			{
				const btSoftBody::Cluster&	c=psb->m_clusters[i];
				const btVector3				r=c.m_nodes[j]->m_x-c.m_com;
				const btVector3				v=c.m_lv+btCross(c.m_av,r);
				idraw->drawLine(c.m_nodes[j]->m_x,c.m_nodes[j]->m_x+v,btVector3(1,0,0));
			}
#endif
			/* Frame		*/ 
	//		btSoftBody::Cluster& c=*psb->m_clusters[i];
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(10,0,0),btVector3(1,0,0));
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(0,10,0),btVector3(0,1,0));
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(0,0,10),btVector3(0,0,1));
		}
	}
	else
	{
		/* Nodes	*/ 
		if(0!=(drawflags&fDrawFlags::Nodes))
		{
			for(i=0;i<psb->m_nodes.size();++i)
			{
				const btSoftBody::Node&	n=psb->m_nodes[i];
				if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				idraw->drawLine(n.m_x-btVector3(scl,0,0),n.m_x+btVector3(scl,0,0),btVector3(1,0,0));
				idraw->drawLine(n.m_x-btVector3(0,scl,0),n.m_x+btVector3(0,scl,0),btVector3(0,1,0));
				idraw->drawLine(n.m_x-btVector3(0,0,scl),n.m_x+btVector3(0,0,scl),btVector3(0,0,1));
			}
		}
		/* Links	*/ 
		if(0!=(drawflags&fDrawFlags::Links))
		{
			for(i=0;i<psb->m_links.size();++i)
			{
				const btSoftBody::Link&	l=psb->m_links[i];
				if(0==(l.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				idraw->drawLine(l.m_n[0]->m_x,l.m_n[1]->m_x,lcolor);
			}
		}
		/* Normals	*/ 
		if(0!=(drawflags&fDrawFlags::Normals))
		{
			for(i=0;i<psb->m_nodes.size();++i)
			{
				const btSoftBody::Node&	n=psb->m_nodes[i];
				if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				const btVector3			d=n.m_n*nscl;
				idraw->drawLine(n.m_x,n.m_x+d,ncolor);
				idraw->drawLine(n.m_x,n.m_x-d,ncolor*0.5);
			}
		}
		/* Contacts	*/ 
		if(0!=(drawflags&fDrawFlags::Contacts))
		{
			static const btVector3		axis[]={btVector3(1,0,0),
				btVector3(0,1,0),
				btVector3(0,0,1)};
			for(i=0;i<psb->m_rcontacts.size();++i)
			{		
				const btSoftBody::RContact&	c=psb->m_rcontacts[i];
				const btVector3				o=	c.m_node->m_x-c.m_cti.m_normal*
					(btDot(c.m_node->m_x,c.m_cti.m_normal)+c.m_cti.m_offset);
				const btVector3				x=btCross(c.m_cti.m_normal,axis[c.m_cti.m_normal.minAxis()]).normalized();
				const btVector3				y=btCross(x,c.m_cti.m_normal).normalized();
				idraw->drawLine(o-x*nscl,o+x*nscl,ccolor);
				idraw->drawLine(o-y*nscl,o+y*nscl,ccolor);
				idraw->drawLine(o,o+c.m_cti.m_normal*nscl*3,btVector3(1,1,0));
			}
		}
		/* Faces	*/ 
	if(0!=(drawflags&fDrawFlags::Faces))
	{
		const btScalar	scl=(btScalar)0.8;
		const btScalar	alp=(btScalar)1;
		const btVector3	col(0,(btScalar)0.7,0);
		for(i=0;i<psb->m_faces.size();++i)
		{
			const btSoftBody::Face&	f=psb->m_faces[i];
			if(0==(f.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			const btVector3			x[]={f.m_n[0]->m_x,f.m_n[1]->m_x,f.m_n[2]->m_x};
			const btVector3			c=(x[0]+x[1]+x[2])/3;
			idraw->drawTriangle((x[0]-c)*scl+c,
				(x[1]-c)*scl+c,
				(x[2]-c)*scl+c,
				col,alp);
		}	
	}
	/* Tetras	*/ 
	if(0!=(drawflags&fDrawFlags::Tetras))
	{
		const btScalar	scl=(btScalar)0.8;
		const btScalar	alp=(btScalar)1;
		const btVector3	col((btScalar)0.3,(btScalar)0.3,(btScalar)0.7);
		for(int i=0;i<psb->m_tetras.size();++i)
		{
			const btSoftBody::Tetra&	t=psb->m_tetras[i];
			if(0==(t.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			const btVector3				x[]={t.m_n[0]->m_x,t.m_n[1]->m_x,t.m_n[2]->m_x,t.m_n[3]->m_x};
			const btVector3				c=(x[0]+x[1]+x[2]+x[3])/4;
			idraw->drawTriangle((x[0]-c)*scl+c,(x[1]-c)*scl+c,(x[2]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[0]-c)*scl+c,(x[1]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[1]-c)*scl+c,(x[2]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[2]-c)*scl+c,(x[0]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
		}	
	}
	}
	/* Anchors	*/ 
	if(0!=(drawflags&fDrawFlags::Anchors))
	{
		for(i=0;i<psb->m_anchors.size();++i)
		{
			const btSoftBody::Anchor&	a=psb->m_anchors[i];
			const btVector3				q=a.m_body->getWorldTransform()*a.m_local;
			drawVertex(idraw,a.m_node->m_x,0.25,btVector3(1,0,0));
			drawVertex(idraw,q,0.25,btVector3(0,1,0));
			idraw->drawLine(a.m_node->m_x,q,btVector3(1,1,1));
		}
		for(i=0;i<psb->m_nodes.size();++i)
		{
			const btSoftBody::Node&	n=psb->m_nodes[i];		
			if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			if(n.m_im<=0)
			{
				drawVertex(idraw,n.m_x,0.25,btVector3(1,0,0));
			}
		}
	}
	

	/* Notes	*/ 
	if(0!=(drawflags&fDrawFlags::Notes))
	{
		for(i=0;i<psb->m_notes.size();++i)
		{
			const btSoftBody::Note&	n=psb->m_notes[i];
			btVector3				p=n.m_offset;
			for(int j=0;j<n.m_rank;++j)
			{
				p+=n.m_nodes[j]->m_x*n.m_coords[j];
			}
			idraw->draw3dText(p,n.m_text);
		}
	}
	/* Node tree	*/ 
	if(0!=(drawflags&fDrawFlags::NodeTree))		DrawNodeTree(psb,idraw);
	/* Face tree	*/ 
	if(0!=(drawflags&fDrawFlags::FaceTree))		DrawFaceTree(psb,idraw);
	/* Cluster tree	*/ 
	if(0!=(drawflags&fDrawFlags::ClusterTree))	DrawClusterTree(psb,idraw);
	/* Joints		*/ 
	if(0!=(drawflags&fDrawFlags::Joints))
	{
		for(i=0;i<psb->m_joints.size();++i)
		{
			const btSoftBody::Joint*	pj=psb->m_joints[i];
			switch(pj->Type())
			{
			case	btSoftBody::Joint::eType::Linear:
				{
					const btSoftBody::LJoint*	pjl=(const btSoftBody::LJoint*)pj;
					const btVector3	a0=pj->m_bodies[0].xform()*pjl->m_refs[0];
					const btVector3	a1=pj->m_bodies[1].xform()*pjl->m_refs[1];
					idraw->drawLine(pj->m_bodies[0].xform().getOrigin(),a0,btVector3(1,1,0));
					idraw->drawLine(pj->m_bodies[1].xform().getOrigin(),a1,btVector3(0,1,1));
					drawVertex(idraw,a0,0.25,btVector3(1,1,0));
					drawVertex(idraw,a1,0.25,btVector3(0,1,1));
				}
				break;
			case	btSoftBody::Joint::eType::Angular:
				{
					//const btSoftBody::AJoint*	pja=(const btSoftBody::AJoint*)pj;
					const btVector3	o0=pj->m_bodies[0].xform().getOrigin();
					const btVector3	o1=pj->m_bodies[1].xform().getOrigin();
					const btVector3	a0=pj->m_bodies[0].xform().getBasis()*pj->m_refs[0];
					const btVector3	a1=pj->m_bodies[1].xform().getBasis()*pj->m_refs[1];
					idraw->drawLine(o0,o0+a0*10,btVector3(1,1,0));
					idraw->drawLine(o0,o0+a1*10,btVector3(1,1,0));
					idraw->drawLine(o1,o1+a0*10,btVector3(0,1,1));
					idraw->drawLine(o1,o1+a1*10,btVector3(0,1,1));
					break;
				}
				default:
				{
				}
					
			}		
		}
	}
}